

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2mem.cpp
# Opt level: O2

float vstr_to_float(char *vstr)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *p;
  char *pcVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  
  cVar1 = *vstr;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    vstr = vstr + 1;
  }
  uVar4 = 0;
  while( true ) {
    uVar3 = (uint)*vstr;
    if (9 < uVar3 - 0x30) break;
    uVar4 = (uVar3 - 0x30) + uVar4 * 10;
    vstr = vstr + 1;
  }
  dVar8 = (double)uVar4;
  if (*vstr == '.') {
    uVar5 = 0;
    uVar4 = 1;
    while( true ) {
      vstr = vstr + 1;
      uVar3 = (uint)*vstr;
      if (9 < uVar3 - 0x30) break;
      uVar5 = (uVar3 - 0x30) + uVar5 * 10;
      uVar4 = uVar4 * 10;
    }
    dVar8 = dVar8 + (double)uVar5 / (double)uVar4;
  }
  if ((uVar3 & 0xff | 0x20) == 0x65) {
    cVar2 = vstr[1];
    if ((cVar2 == '-') || (cVar2 == '+')) {
      pcVar6 = vstr + 2;
    }
    else {
      pcVar6 = vstr + 1;
    }
    uVar4 = 0;
    for (; (int)*pcVar6 - 0x30U < 10; pcVar6 = pcVar6 + 1) {
      uVar4 = ((int)*pcVar6 - 0x30U) + uVar4 * 10;
    }
    dVar9 = 1.0;
    for (; 7 < uVar4; uVar4 = uVar4 - 8) {
      dVar9 = dVar9 * 100000000.0;
    }
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      dVar9 = dVar9 * 10.0;
    }
    if (cVar2 == '-') {
      dVar8 = dVar8 / dVar9;
    }
    else {
      dVar8 = dVar8 * dVar9;
    }
  }
  fVar7 = (float)dVar8;
  if (cVar1 == '-') {
    fVar7 = -fVar7;
  }
  return fVar7;
}

Assistant:

static float vstr_to_float(const char vstr[16])
{
    double v = 0.0;

    const char* p = vstr;

    // sign
    bool sign = *p != '-';
    if (*p == '+' || *p == '-')
    {
        p++;
    }

    // digits before decimal point or exponent
    unsigned int v1 = 0;
    while (isdigit(*p))
    {
        v1 = v1 * 10 + (*p - '0');
        p++;
    }

    v = (double)v1;

    // digits after decimal point
    if (*p == '.')
    {
        p++;

        unsigned int pow10 = 1;
        unsigned int v2 = 0;

        while (isdigit(*p))
        {
            v2 = v2 * 10 + (*p - '0');
            pow10 *= 10;
            p++;
        }

        v += v2 / (double)pow10;
    }

    // exponent
    if (*p == 'e' || *p == 'E')
    {
        p++;

        // sign of exponent
        bool fact = *p != '-';
        if (*p == '+' || *p == '-')
        {
            p++;
        }

        // digits of exponent
        unsigned int expon = 0;
        while (isdigit(*p))
        {
            expon = expon * 10 + (*p - '0');
            p++;
        }

        double scale = 1.0;
        while (expon >= 8)
        {
            scale *= 1e8;
            expon -= 8;
        }
        while (expon > 0)
        {
            scale *= 10.0;
            expon -= 1;
        }

        v = fact ? v * scale : v / scale;
    }

    //     fprintf(stderr, "v = %f\n", v);
    return sign ? (float)v : (float)-v;
}